

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRet.c
# Opt level: O0

void Rtm_ObjAddFanin(Rtm_Obj_t *pObj,Rtm_Obj_t *pFanin,int fCompl)

{
  int fCompl_local;
  Rtm_Obj_t *pFanin_local;
  Rtm_Obj_t *pObj_local;
  
  (&pObj[1].pCopy)[(int)((*(uint *)&pObj->field_0x8 >> 7 & 0xff) << 1)] = pFanin;
  (&pObj[1].pCopy)[(int)((*(uint *)&pObj->field_0x8 >> 7 & 0xff) * 2 + 1)] = (void *)0x0;
  (&pFanin[1].pCopy)[(int)(((*(uint *)&pFanin->field_0x8 >> 0xf) + pFanin->nFanouts) * 2)] = pObj;
  (&pFanin[1].pCopy)[(int)(((*(uint *)&pFanin->field_0x8 >> 0xf) + pFanin->nFanouts) * 2 + 1)] =
       &pObj[1].field_0x8 + (long)(int)((*(uint *)&pObj->field_0x8 >> 7 & 0xff) << 1) * 8;
  if ((*(uint *)&pObj->field_0x8 >> 7 & 0xff) == 0) {
    *(uint *)&pObj->field_0x8 = *(uint *)&pObj->field_0x8 & 0xffffffdf | (fCompl & 1U) << 5;
  }
  else {
    if ((*(uint *)&pObj->field_0x8 >> 7 & 0xff) != 1) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigRet.c"
                    ,0x19f,"void Rtm_ObjAddFanin(Rtm_Obj_t *, Rtm_Obj_t *, int)");
    }
    *(uint *)&pObj->field_0x8 = *(uint *)&pObj->field_0x8 & 0xffffffbf | (fCompl & 1U) << 6;
  }
  *(uint *)&pObj->field_0x8 =
       *(uint *)&pObj->field_0x8 & 0xffff807f |
       ((*(uint *)&pObj->field_0x8 >> 7 & 0xff) + 1 & 0xff) << 7;
  pFanin->nFanouts = pFanin->nFanouts + 1;
  if ((*(uint *)&pObj->field_0x8 >> 7 & 0xff) <= *(uint *)&pObj->field_0x8 >> 0xf) {
    if (pFanin->nFanouts <= pFanin->Temp) {
      return;
    }
    __assert_fail("pFanin->nFanouts <= pFanin->Temp",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigRet.c"
                  ,0x1a3,"void Rtm_ObjAddFanin(Rtm_Obj_t *, Rtm_Obj_t *, int)");
  }
  __assert_fail("pObj->nFanins <= pObj->Num",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigRet.c"
                ,0x1a2,"void Rtm_ObjAddFanin(Rtm_Obj_t *, Rtm_Obj_t *, int)");
}

Assistant:

void Rtm_ObjAddFanin( Rtm_Obj_t * pObj, Rtm_Obj_t * pFanin, int fCompl )
{
    pObj->pFanio[ 2*pObj->nFanins ] = pFanin;
    pObj->pFanio[ 2*pObj->nFanins + 1 ] = NULL;
    pFanin->pFanio[ 2*(pFanin->Num + pFanin->nFanouts) ] = pObj;
    pFanin->pFanio[ 2*(pFanin->Num + pFanin->nFanouts) + 1 ] = pObj->pFanio + 2*pObj->nFanins + 1;
    if ( pObj->nFanins == 0 )
        pObj->fCompl0 = fCompl;
    else if ( pObj->nFanins == 1 )
        pObj->fCompl1 = fCompl;
    else
        assert( 0 );
    pObj->nFanins++;
    pFanin->nFanouts++;
    assert( pObj->nFanins <= pObj->Num );
    assert( pFanin->nFanouts <= pFanin->Temp );
}